

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jieba.hpp
# Opt level: O1

void __thiscall
cppjieba::Jieba::Jieba
          (Jieba *this,string *dict_path,string *model_path,string *user_dict_path,string *idfPath,
          string *stopWordPath)

{
  HMMModel *this_00;
  
  DictTrie::DictTrie(&this->dict_trie_,dict_path,user_dict_path,WordWeightMedian);
  this_00 = &this->model_;
  HMMModel::HMMModel(this_00,model_path);
  SegmentBase::SegmentBase((SegmentBase *)&this->mp_seg_);
  (this->mp_seg_).super_SegmentTagged.super_SegmentBase._vptr_SegmentBase =
       (_func_int **)&PTR__MPSegment_00194188;
  (this->mp_seg_).dictTrie_ = &this->dict_trie_;
  (this->mp_seg_).isNeedDestroy_ = false;
  SegmentBase::SegmentBase(&(this->hmm_seg_).super_SegmentBase);
  (this->hmm_seg_).super_SegmentBase._vptr_SegmentBase = (_func_int **)&PTR__HMMSegment_001941d8;
  (this->hmm_seg_).model_ = this_00;
  (this->hmm_seg_).isNeedDestroy_ = false;
  MixSegment::MixSegment(&this->mix_seg_,&this->dict_trie_,this_00);
  SegmentBase::SegmentBase(&(this->full_seg_).super_SegmentBase);
  (this->full_seg_).super_SegmentBase._vptr_SegmentBase = (_func_int **)&PTR__FullSegment_00194d18;
  (this->full_seg_).dictTrie_ = &this->dict_trie_;
  (this->full_seg_).isNeedDestroy_ = false;
  QuerySegment::QuerySegment(&this->query_seg_,&this->dict_trie_,this_00);
  KeywordExtractor::KeywordExtractor
            (&this->extractor,&this->dict_trie_,this_00,idfPath,stopWordPath);
  return;
}

Assistant:

Jieba(const string& dict_path, 
        const string& model_path,
        const string& user_dict_path, 
        const string& idfPath, 
        const string& stopWordPath) 
    : dict_trie_(dict_path, user_dict_path),
      model_(model_path),
      mp_seg_(&dict_trie_),
      hmm_seg_(&model_),
      mix_seg_(&dict_trie_, &model_),
      full_seg_(&dict_trie_),
      query_seg_(&dict_trie_, &model_),
      extractor(&dict_trie_, &model_, idfPath, stopWordPath) {
  }